

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O2

void annEnclRect(ANNpointArray pa,ANNidxArray pidx,int n,int dim,ANNorthRect *bnds)

{
  double dVar1;
  ANNpoint pAVar2;
  ANNpoint pAVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  double dVar8;
  ANNcoord AVar9;
  ANNcoord AVar10;
  
  pAVar2 = bnds->lo;
  uVar6 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar6;
  }
  pAVar3 = bnds->hi;
  uVar4 = (ulong)(uint)dim;
  if (dim < 1) {
    uVar4 = uVar6;
  }
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    AVar9 = pa[*pidx][uVar6];
    AVar10 = AVar9;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      dVar1 = pa[pidx[uVar7]][uVar6];
      dVar8 = dVar1;
      if ((dVar1 < AVar9) || (dVar8 = AVar9, dVar1 <= AVar10)) {
        AVar9 = dVar8;
        dVar1 = AVar10;
      }
      AVar10 = dVar1;
    }
    pAVar2[uVar6] = AVar9;
    pAVar3[uVar6] = AVar10;
  }
  return;
}

Assistant:

void annEnclRect(ANNpointArray pa,   // point array
                 ANNidxArray pidx,   // point indices
                 int n,              // number of points
                 int dim,            // dimension
                 ANNorthRect &bnds)  // bounding cube (returned)
{
    for (int d = 0; d < dim; d++) {  // find smallest enclosing rectangle
        ANNcoord lo_bnd = PA(0, d);  // lower bound on dimension d
        ANNcoord hi_bnd = PA(0, d);  // upper bound on dimension d
        for (int i = 0; i < n; i++) {
            if (PA(i, d) < lo_bnd)
                lo_bnd = PA(i, d);
            else if (PA(i, d) > hi_bnd)
                hi_bnd = PA(i, d);
        }
        bnds.lo[d] = lo_bnd;
        bnds.hi[d] = hi_bnd;
    }
}